

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.cpp
# Opt level: O0

Float pbrt::FresnelMoment1(Float eta)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Float eta5;
  Float eta4;
  Float eta3;
  Float eta2;
  Float eta_local;
  undefined4 local_4;
  
  fVar1 = eta * eta;
  fVar2 = fVar1 * eta;
  fVar3 = fVar2 * eta;
  if (1.0 <= eta) {
    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x4131d14e),0),ZEXT416((uint)eta),
                             SUB6416(ZEXT464(0xc093bd51),0));
    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1276f00),0),ZEXT416((uint)fVar1),auVar4);
    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40a3aa65),0),ZEXT416((uint)fVar2),auVar4);
    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbfa2d03e),0),ZEXT416((uint)fVar3),auVar4);
    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3e0284e0),0),ZEXT416((uint)(fVar3 * eta)),auVar4);
    local_4 = auVar4._0_4_;
  }
  else {
    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbfdeacda),0),ZEXT416((uint)eta),
                             SUB6416(ZEXT464(0x3eeb588e),0));
    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40581b86),0),ZEXT416((uint)fVar1),auVar4);
    auVar5._0_8_ = (double)auVar4._0_4_;
    auVar5._8_8_ = 0;
    auVar4._0_8_ = (double)fVar2;
    auVar4._8_8_ = 0;
    auVar4 = vfmadd213sd_fma(ZEXT816(0xc00f3d53cddd6e05),auVar4,auVar5);
    local_4 = (float)((auVar4._0_8_ + (double)(fVar3 * 2.49277)) - (double)(fVar3 * eta * 0.68441));
  }
  return local_4;
}

Assistant:

Float FresnelMoment1(Float eta) {
    Float eta2 = eta * eta, eta3 = eta2 * eta, eta4 = eta3 * eta, eta5 = eta4 * eta;
    if (eta < 1)
        return 0.45966f - 1.73965f * eta + 3.37668f * eta2 - 3.904945 * eta3 +
               2.49277f * eta4 - 0.68441f * eta5;
    else
        return -4.61686f + 11.1136f * eta - 10.4646f * eta2 + 5.11455f * eta3 -
               1.27198f * eta4 + 0.12746f * eta5;
}